

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O2

void Image_Function::Sobel
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  imageException *this;
  FilterKernel<4U> *pFVar11;
  long lVar12;
  uint uVar13;
  uchar *puVar14;
  ulong uVar15;
  uchar *puVar16;
  uint uVar17;
  uchar *puVar18;
  long lVar19;
  uint8_t uVar20;
  long lVar21;
  uchar *puVar22;
  ulong uVar23;
  uchar *puVar24;
  uchar *puVar25;
  uchar *puVar26;
  uchar *__s;
  ulong uVar27;
  uchar *puVar28;
  uchar *puVar29;
  undefined1 auVar30 [16];
  undefined1 in_register_000012c4 [12];
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  if ((2 < width) && (2 < height)) {
    uVar3 = in->_width;
    uVar4 = in->_height;
    uVar13 = startXIn + 1 + width;
    uVar27 = (ulong)(startXIn != 0);
    uVar17 = startYIn + 1 + height;
    uVar5 = in->_rowSize;
    uVar15 = (ulong)uVar5;
    puVar7 = in->_data;
    uVar6 = out->_rowSize;
    uVar23 = (ulong)(((startYIn + 1) - (uint)(startYIn != 0)) * uVar5);
    __s = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar6);
    if (startYIn == 0) {
      memset(__s,0,(ulong)width);
      __s = __s + uVar6;
    }
    lVar9 = (uVar23 + startXIn) - uVar27;
    if (Sobel(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
        ::kernel == '\0') {
      iVar10 = __cxa_guard_acquire();
      if (iVar10 != 0) {
        pFVar11 = &Sobel::kernel;
        for (lVar12 = 0; lVar12 != 0x400; lVar12 = lVar12 + 1) {
          lVar21 = 0;
          for (lVar19 = 0; lVar12 + lVar19 != 0x400; lVar19 = lVar19 + 1) {
            iVar10 = (int)(lVar12 + lVar19);
            auVar30._0_4_ = (float)(iVar10 * iVar10 + (int)lVar12 * (int)lVar12);
            auVar30._4_12_ = in_register_000012c4;
            auVar30 = vsqrtss_avx(auVar30,auVar30);
            auVar30 = vfmadd213ss_fma(auVar30,SUB6416(ZEXT464(0x3e3504f3),0),
                                      SUB6416(ZEXT464(0x3f000000),0));
            uVar20 = (uint8_t)(int)auVar30._0_4_;
            *(uint8_t *)((long)pFVar11 + lVar21) = uVar20;
            *(uint8_t *)((long)pFVar11 + lVar19) = uVar20;
            lVar21 = lVar21 + 0x400;
          }
          pFVar11 = (FilterKernel<4U> *)((long)pFVar11 + 0x401);
        }
        __cxa_guard_release(&Sobel(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
                             ::kernel);
      }
    }
    lVar21 = startXIn - uVar27;
    lVar12 = lVar21 + uVar23;
    lVar21 = uVar23 + 1 + lVar21;
    puVar22 = puVar7 + lVar12 + (ulong)(uVar5 - 1) + 1;
    puVar25 = puVar7 + lVar12;
    puVar18 = puVar7 + (ulong)(uVar5 + 1) + lVar12 + 1;
    puVar26 = puVar7 + lVar12 + uVar15 + 1;
    puVar16 = puVar7 + (lVar21 - (ulong)(uVar5 + 1));
    puVar24 = puVar7 + (lVar21 - (ulong)(uVar5 - 1));
    puVar14 = puVar7 + (lVar21 - uVar15);
    for (puVar28 = puVar7 + lVar9 + 1;
        puVar28 !=
        puVar7 + (ulong)((height + (startYIn != 0) + (uint)(uVar17 < uVar4) + -2) * uVar5) +
                 lVar9 + 1; puVar28 = puVar28 + uVar15) {
      puVar29 = __s;
      if (startXIn == 0) {
        puVar29 = __s + 1;
        *__s = '\0';
      }
      for (uVar27 = 0; (startXIn != 0 | 0xfffffffe) + width + (uint)(uVar13 < uVar3) != uVar27;
          uVar27 = uVar27 + 1) {
        uVar1 = ((((uint)puVar16[uVar27] - (uint)puVar18[uVar27]) + (uint)puVar22[uVar27]) -
                (uint)puVar24[uVar27]) + ((uint)puVar25[uVar27] - (uint)puVar25[uVar27 + 2]) * 2;
        uVar2 = (((uint)puVar16[uVar27] - (uint)puVar18[uVar27]) - (uint)puVar22[uVar27]) +
                (uint)puVar24[uVar27] + ((uint)puVar14[uVar27] - (uint)puVar26[uVar27]) * 2;
        uVar8 = -uVar1;
        if (0 < (int)uVar1) {
          uVar8 = uVar1;
        }
        uVar1 = -uVar2;
        if (0 < (int)uVar2) {
          uVar1 = uVar2;
        }
        puVar29[uVar27] = Sobel::kernel.kernel[uVar8][uVar1];
      }
      if (uVar3 <= uVar13) {
        puVar29[uVar27] = '\0';
      }
      __s = __s + uVar6;
      puVar16 = puVar16 + uVar15;
      puVar18 = puVar18 + uVar15;
      puVar22 = puVar22 + uVar15;
      puVar24 = puVar24 + uVar15;
      puVar25 = puVar25 + uVar15;
      puVar14 = puVar14 + uVar15;
      puVar26 = puVar26 + uVar15;
    }
    if (uVar4 <= uVar17) {
      memset(__s,0,(ulong)width);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Input image is very small for Sobel filter to be applied");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Sobel( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( width < 3 || height < 3 )
            throw imageException( "Input image is very small for Sobel filter to be applied" );

        const uint32_t startXOffset = (startXIn > 0u) ? 1u : 0u;
        const uint32_t startYOffset = (startYIn > 0u) ? 1u : 0u;
        const uint32_t endXOffset   = ((startXIn + width  + 1u) < in.width ()) ? 1u : 0u;
        const uint32_t endYOffset   = ((startYIn + height + 1u) < in.height()) ? 1u : 0u;

        // Create the map of gradient values
        const uint32_t gradientWidth  = width  - ( ((startXOffset > 0u) ? 0u : 1u) + ((endXOffset > 0u) ? 0u : 1u) );
        const uint32_t gradientHeight = height - ( ((startYOffset > 0u) ? 0u : 1u) + ((endYOffset > 0u) ? 0u : 1u) );

        const float multiplier = 1.0f / ( 4.0f * sqrtf( 2.0f ) );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + (startYIn + 1u - startYOffset) * rowSizeIn + startXIn + 1u - startXOffset;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * inYEnd = inY + gradientHeight * rowSizeIn;

        if ( startYOffset == 0u ) {
            // fill top row with zeros
            memset( outY, 0, width );
            outY += rowSizeOut;
        }

        const uint32_t yPlusX  = rowSizeIn + 1u;
        const uint32_t yMinusX = rowSizeIn - 1u;
        static const FilterKernel<4u> kernel(multiplier);

        for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
            uint8_t       * outX   = outY;

            if ( startXOffset == 0u ) {
                // set first pixel in row to 0
                *outX = 0;
                ++outX;
            }

            const uint8_t * inX    = inY;
            const uint8_t * inXEnd = inX + gradientWidth;

            for( ; inX != inXEnd; ++inX, ++outX ) {
                //      | +1  0 -1|
                // Gx = | +2  0 -2|
                //      | +1  0 -1|

                //      | +1 +2 +1|
                // Gy = |  0  0  0|
                //      | -1 -2 -1|

                const int32_t partialG = static_cast<int32_t>(*(inX - yPlusX )) - *(inX + yPlusX ); // [y - 1; x - 1] - [y + 1; x + 1]

                const int32_t gX = partialG + *(inX + yMinusX) - *(inX - yMinusX) + 2 * ( static_cast<int32_t>(*(inX - 1        )) - (*(inX + 1        )) );
                const int32_t gY = partialG + *(inX - yMinusX) - *(inX + yMinusX) + 2 * ( static_cast<int32_t>(*(inX - rowSizeIn)) - (*(inX + rowSizeIn)) );

                *outX = kernel.kernel[(gX < 0) ? -gX : gX][(gY < 0) ? -gY : gY];
            }

            if ( endXOffset == 0u ) {
                // set last pixel in row to 0
                *outX = 0;
            }
        }

        if ( endYOffset == 0u ) {
            // fill bottom row with zeros
            memset( outY, 0, width );
        }
    }